

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O1

bool __thiscall
EmmyFacade::TcpConnect(EmmyFacade *this,lua_State *L,string *host,int port,string *err)

{
  string *psVar1;
  bool bVar2;
  shared_ptr<SocketClientTransporter> c;
  undefined1 local_59;
  string *local_58;
  SocketClientTransporter *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_58 = err;
  Destroy(this);
  EmmyDebuggerManager::AddDebugger
            ((EmmyDebuggerManager *)&stack0xffffffffffffffc0,
             (lua_State *)&this->_emmyDebuggerManager);
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  (*lua_sethook)(L,ReadyLuaHook,7,0);
  local_50 = (SocketClientTransporter *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<SocketClientTransporter,std::allocator<SocketClientTransporter>>
            (&local_48,&local_50,(allocator<SocketClientTransporter> *)&local_59);
  (this->transporter).super___shared_ptr<Transporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_50->super_Transporter;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->transporter).super___shared_ptr<Transporter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_48);
  psVar1 = local_58;
  bVar2 = SocketClientTransporter::Connect(local_50,host,port,local_58);
  if (bVar2) {
    WaitIDE(this,true,0);
  }
  else {
    (*lua_pushcclosure)(L,LuaError,0);
    (*lua_pushstring)(L,(psVar1->_M_dataplus)._M_p);
    lua_call(L,1,0);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  return bVar2;
}

Assistant:

bool EmmyFacade::TcpConnect(lua_State *L, const std::string &host, int port, std::string &err) {
	Destroy();

	_emmyDebuggerManager.AddDebugger(L);

	SetReadyHook(L);

	const auto c = std::make_shared<SocketClientTransporter>();
	transporter = c;
	// c->SetHandler(shared_from_this());
	const auto suc = c->Connect(host, port, err);
	if (suc) {
		WaitIDE(true);
	} else {
		lua_pushcfunction(L, LuaError);
		lua_pushstring(L, err.c_str());
		lua_call(L, 1, 0);
	}
	return suc;
}